

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O3

void __thiscall ExprWriter::visit(ExprWriter *this,CallExpr *expr)

{
  pointer ppEVar1;
  bool bVar2;
  int iVar3;
  pointer ppEVar4;
  Expr *call;
  Expr *pEVar5;
  bool bVar6;
  
  iVar3 = std::__cxx11::string::compare((char *)&expr->funcName);
  if (iVar3 == 0) {
    bVar6 = true;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&expr->funcName);
    bVar6 = iVar3 == 0;
  }
  pEVar5 = expr->funcValue;
  if (pEVar5 == (Expr *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->ss,(expr->funcName)._M_dataplus._M_p,(expr->funcName)._M_string_length);
  }
  else {
    if (this->noFuncCasts == true) {
      do {
        bVar2 = CastExpr::classof(pEVar5);
        if (!bVar2) goto LAB_001610fd;
        pEVar5 = *(Expr **)&pEVar5[1].kind;
      } while (pEVar5 != (Expr *)0x0);
      pEVar5 = (Expr *)0x0;
    }
LAB_001610fd:
    parensIfNotSimple(this,pEVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,"(",1);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>(this->ss,"(void*)(",8);
  }
  ppEVar4 = (expr->params).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (expr->params).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar4 != ppEVar1) {
    bVar2 = true;
    do {
      pEVar5 = *ppEVar4;
      if (bVar2) {
        (*pEVar5->_vptr_Expr[2])(pEVar5,this);
        if (bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(this->ss,", ",2);
        (*pEVar5->_vptr_Expr[2])(pEVar5,this);
      }
      ppEVar4 = ppEVar4 + 1;
      bVar2 = false;
    } while (ppEVar4 != ppEVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
  return;
}

Assistant:

void ExprWriter::visit(CallExpr& expr) {
    bool isVaFunc = (expr.funcName == "va_start" || expr.funcName == "va_end");

    if (expr.funcValue) {
        auto call = expr.funcValue;

        if (noFuncCasts) {
            // strip all the casts
            while (auto CAST = llvm::dyn_cast_or_null<CastExpr>(call)) {
                call = CAST->expr;
            }
        }

        parensIfNotSimple(call);
    } else {
        ss << expr.funcName;
    }

    ss << "(";
    if (isVaFunc) {
        ss << "(void*)(";
    }

    bool first = true;
    for (auto param : expr.params) {
        if (first) {
            param->accept(*this);
            if (isVaFunc) {
                ss << ")";
            }

        } else {
            ss << ", ";
            param->accept(*this);
        }

        first = false;
    }

    ss << ")";
}